

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_EndProcessing
                  (PaAlsaStreamComponent *self,unsigned_long numFrames,int *xrun)

{
  snd_pcm_format_t sVar1;
  snd_pcm_t *psVar2;
  snd_pcm_uframes_t sVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 *puVar6;
  int iVar7;
  int iVar8;
  undefined1 *in_RAX;
  pthread_t __thread1;
  char *errorText;
  void *pvVar9;
  PaError PVar10;
  undefined1 **ppuVar11;
  long lVar12;
  undefined8 uStack_40;
  undefined1 *local_38;
  
  ppuVar11 = &local_38;
  local_38 = (undefined1 *)&local_38;
  PVar10 = 0;
  if (self->ready == 0) {
    return 0;
  }
  puVar6 = in_RAX;
  if (self->canMmap == 0) {
    iVar7 = 0;
    ppuVar11 = &local_38;
    puVar6 = in_RAX;
    if (self->streamDir == StreamDirection_Out) {
      if (self->hostInterleaved == 0) {
        lVar5 = -((ulong)(uint)self->numHostChannels * 8 + 0xf & 0xfffffffffffffff0);
        sVar1 = self->nativeFormat;
        *(undefined8 *)((long)&uStack_40 + lVar5) = 0x111819;
        iVar8 = snd_pcm_format_size(sVar1);
        pvVar9 = self->nonMmapBuffer;
        iVar7 = self->numHostChannels;
        for (lVar12 = 0; lVar12 < iVar7; lVar12 = lVar12 + 1) {
          *(void **)((long)&local_38 + lVar5 + lVar12 * 8) = pvVar9;
          pvVar9 = (void *)((long)pvVar9 + (long)iVar8);
        }
        psVar2 = self->pcm;
        *(undefined8 *)((long)&uStack_40 + lVar5) = 0x111849;
        iVar7 = snd_pcm_writen(psVar2,(long)&local_38 + lVar5,numFrames);
        ppuVar11 = (undefined1 **)local_38;
        puVar6 = local_38;
      }
      else {
        uStack_40 = 0x1117e4;
        local_38 = in_RAX;
        iVar7 = snd_pcm_writei(self->pcm,self->nonMmapBuffer,numFrames);
        ppuVar11 = &local_38;
        puVar6 = local_38;
      }
    }
    local_38 = puVar6;
    puVar6 = local_38;
    if (self->canMmap == 0) goto LAB_0011186d;
  }
  local_38 = puVar6;
  psVar2 = self->pcm;
  sVar3 = self->offset;
  *(undefined8 *)((long)ppuVar11 + -8) = 0x11186a;
  iVar7 = snd_pcm_mmap_commit(psVar2,sVar3,numFrames);
LAB_0011186d:
  if ((iVar7 == -0x20) || (iVar7 == -0x56)) {
    *xrun = 1;
  }
  else if (iVar7 < 0) {
    *(undefined8 *)((long)ppuVar11 + -8) = 0x11189d;
    __thread1 = pthread_self();
    *(undefined8 *)((long)ppuVar11 + -8) = 0x1118af;
    iVar8 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar8 != 0) {
      *(undefined8 *)((long)ppuVar11 + -8) = 0x1118be;
      errorText = (char *)snd_strerror(iVar7);
      *(undefined8 *)((long)ppuVar11 + -8) = 8;
      uVar4 = *(undefined8 *)((long)ppuVar11 + -8);
      *(undefined8 *)((long)ppuVar11 + -8) = 0x1118cc;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar7,errorText);
    }
    *(undefined8 *)((long)ppuVar11 + -8) = 0x1118da;
    PaUtil_DebugPrint(
                     "Expression \'res\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3497\n"
                     );
    PVar10 = -9999;
  }
  return PVar10;
}

Assistant:

static PaError PaAlsaStreamComponent_EndProcessing( PaAlsaStreamComponent *self, unsigned long numFrames, int *xrun )
{
    PaError result = paNoError;
    int res = 0;

    /* @concern FullDuplex It is possible that only one direction is marked ready after polling, and processed
     * afterwards
     */
    if( !self->ready )
        goto end;

    if( !self->canMmap && StreamDirection_Out == self->streamDir )
    {
        /* Play sound */
        if( self->hostInterleaved )
            res = alsa_snd_pcm_writei( self->pcm, self->nonMmapBuffer, numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            int bufsize = alsa_snd_pcm_format_size( self->nativeFormat, self->framesPerPeriod + 1 );
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += bufsize;
            }
            res = alsa_snd_pcm_writen( self->pcm, bufs, numFrames );
        }
    }

    if( self->canMmap )
        res = alsa_snd_pcm_mmap_commit( self->pcm, self->offset, numFrames );

    if( res == -EPIPE || res == -ESTRPIPE )
    {
        *xrun = 1;
    }
    else
    {
        ENSURE_( res, paUnanticipatedHostError );
    }

end:
error:
    return result;
}